

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

void __thiscall
Clasp::SharedContext::setConfiguration(SharedContext *this,Configuration *c,Type ownership)

{
  Share SVar1;
  LogPtr pEVar2;
  uint uVar3;
  SatPreParams *opts;
  SatPreprocessor *pSVar4;
  Share SVar5;
  bool bVar6;
  ulong uVar7;
  Share SVar8;
  Configuration *pCVar9;
  SatPreprocessor *pSVar10;
  undefined1 *puVar11;
  long *plVar12;
  
  puVar11 = config_def_s;
  if (c != (Configuration *)0x0) {
    puVar11 = (undefined1 *)c;
  }
  pEVar2 = this->progress_;
  if ((pEVar2 != (LogPtr)0x0) && (pEVar2->sys_ != 0)) {
    pEVar2->sys_ = 0;
  }
  bVar6 = c != (Configuration *)0x0 && ownership == Acquire;
  uVar7 = (this->config_).ptr_;
  pCVar9 = (Configuration *)(uVar7 & 0xfffffffffffffffe);
  if ((Configuration *)puVar11 == pCVar9) {
    if (bVar6 != (bool)((byte)uVar7 & 1)) {
      (this->config_).ptr_ = (ulong)pCVar9 | (ulong)bVar6;
    }
  }
  else {
    if (((uVar7 & 1) != 0) && ((this->config_).ptr_ = (uintp)pCVar9, pCVar9 != (Configuration *)0x0)
       ) {
      (*pCVar9->_vptr_Configuration[1])();
    }
    plVar12 = (long *)((ulong)puVar11 & 0xfffffffffffffffe);
    (this->config_).ptr_ = (ulong)bVar6 | (ulong)plVar12;
    (**(code **)(*plVar12 + 0x10))(plVar12,this);
    opts = (SatPreParams *)
           (**(code **)(*(long *)((this->config_).ptr_ & 0xfffffffffffffffe) + 0x18))();
    SVar1 = this->share_;
    SVar8 = (Share)((uint)SVar1 & 0xff8fffff | (*(byte *)(opts + 1) & 7) << 0x14);
    SVar5 = (Share)((uint)SVar1 | 0x700000);
    if (((uint)SVar1 & 0x3fe) == 0) {
      SVar5 = SVar8;
    }
    if ((*(byte *)(opts + 1) & 7) != 4) {
      SVar5 = SVar8;
    }
    this->share_ = SVar5;
    uVar3 = (*(uint *)(opts + 1) & 0x20) << 0x12;
    this->share_ = (Share)((uint)SVar5 & 0xff7fffff | uVar3);
    this->share_ = (Share)((uint)SVar5 & 0xfb7fffff | uVar3 | (*(uint *)(opts + 1) & 0x40) << 0x14);
    if (((this->satPrepro).ptr_ < 2) && (((ulong)*opts & 3) != 0)) {
      pSVar4 = SatPreParams::create(opts);
      uVar7 = (this->satPrepro).ptr_;
      if (((uVar7 & 1) != 0) &&
         ((pSVar10 = (SatPreprocessor *)(uVar7 & 0xfffffffffffffffe), pSVar4 != pSVar10 &&
          ((this->satPrepro).ptr_ = (uintp)pSVar10, pSVar10 != (SatPreprocessor *)0x0)))) {
        (*pSVar10->_vptr_SatPreprocessor[1])();
      }
      (this->satPrepro).ptr_ = (ulong)pSVar4 | 1;
    }
    if (((ulong)opts[1] & 0x18) != 0) {
      SolverStats::enableExtended(&(*(this->solvers_).ebo_.buf)->stats);
    }
    if ((this->solvers_).ebo_.size != 0) {
      uVar7 = 0;
      do {
        Solver::resetConfig((this->solvers_).ebo_.buf[uVar7]);
        uVar3 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar3;
      } while (uVar3 != (this->solvers_).ebo_.size);
    }
  }
  return;
}

Assistant:

void SharedContext::setConfiguration(Configuration* c, Ownership_t::Type ownership) {
	bool own = ownership == Ownership_t::Acquire;
	if (c == 0) { c = &config_def_s; own = false; }
	report(Event::subsystem_facade);
	if (config_.get() != c) {
		config_ = c;
		if (!own) config_.release();
		config_->prepare(*this);
		const ContextParams& opts = config_->context();
		setShareMode(static_cast<ContextParams::ShareMode>(opts.shareMode));
		setShortMode(static_cast<ContextParams::ShortMode>(opts.shortMode));
		share_.seed   = opts.seed;
		if (satPrepro.get() == 0 && opts.satPre.type != SatPreParams::sat_pre_no) {
			satPrepro.reset(SatPreParams::create(opts.satPre));
		}
		enableStats(opts.stats);
		// force update on next call to Solver::startInit()
		for (uint32 i = 0; i != solvers_.size(); ++i) {
			solvers_[i]->resetConfig();
		}
	}
	else if (own != config_.is_owner()) {
		if (own) config_.acquire();
		else     config_.release();
	}
}